

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_indexOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int special)

{
  float fVar1;
  JSVarRef *pJVar2;
  long lVar3;
  bool bVar4;
  JSValue obj;
  JSValue val;
  JSValue val_00;
  JSValue JVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  BOOL BVar9;
  void *pvVar10;
  ulong uVar11;
  int in_ECX;
  JSObject *in_RSI;
  JSContext *in_RDI;
  JSValue *in_R8;
  int in_R9D;
  float fVar12;
  double *pv_6;
  double *pv_5;
  float *pv_4;
  float *pv_3;
  uint32_t v_2;
  uint32_t *pv_2;
  uint16_t v_1;
  uint16_t *pv_1;
  uint16_t v;
  uint8_t *pp;
  uint8_t *pv;
  float f;
  double d;
  int64_t v64;
  int res;
  int inc;
  int stop;
  int k;
  int is_bigint;
  int is_int;
  int tag;
  int len;
  JSObject *p;
  JSContext *in_stack_fffffffffffffee8;
  JSValueUnion in_stack_fffffffffffffef0;
  double *in_stack_fffffffffffffef8;
  JSContext *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  JSContext *in_stack_ffffffffffffff10;
  undefined6 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1e;
  int64_t in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff30;
  double local_b8;
  ulong local_b0;
  uint local_a8;
  int local_a4;
  uint local_a0;
  uint local_9c;
  uint local_50;
  undefined4 uStack_4c;
  int64_t local_48;
  undefined4 uStack_2c;
  undefined4 uStack_c;
  
  local_a8 = 0xffffffff;
  obj.tag = (int64_t)in_stack_fffffffffffffef8;
  obj.u.float64 = in_stack_fffffffffffffef0.float64;
  uVar7 = js_typed_array_get_length_internal(in_stack_fffffffffffffee8,obj);
  if ((int)uVar7 < 0) {
LAB_001c3548:
    local_50 = 0;
    local_48 = 6;
    goto LAB_001c355f;
  }
  if (uVar7 != 0) {
    if (in_R9D == 1) {
      local_9c = uVar7 - 1;
      if (1 < in_ECX) {
        val.u._4_4_ = in_stack_ffffffffffffff0c;
        val.u.int32 = in_stack_ffffffffffffff08;
        val.tag = (int64_t)in_stack_ffffffffffffff10;
        iVar8 = JS_ToFloat64(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,val);
        if (iVar8 != 0) goto LAB_001c3548;
        if (NAN(local_b8)) {
          local_9c = 0;
        }
        else if (local_b8 < 0.0) {
          if ((double)(int)uVar7 + local_b8 < 0.0) goto switchD_001c2fd2_default;
          local_9c = (uint)((double)(int)uVar7 + local_b8);
        }
        else if (local_b8 < (double)(int)local_9c) {
          local_9c = (uint)local_b8;
        }
      }
      local_a0 = 0xffffffff;
      local_a4 = -1;
    }
    else {
      local_9c = 0;
      if ((1 < in_ECX) &&
         (val_00.u._6_2_ = in_stack_ffffffffffffff1e, val_00.u._0_6_ = in_stack_ffffffffffffff18,
         val_00.tag = in_stack_ffffffffffffff20,
         iVar8 = JS_ToInt32Clamp(in_stack_ffffffffffffff10,
                                 (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                ),val_00,
                                 (int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                                 (int)in_stack_ffffffffffffff00,in_stack_ffffffffffffff30),
         iVar8 != 0)) goto LAB_001c3548;
      local_a4 = 1;
      local_a0 = uVar7;
    }
    BVar9 = typed_array_is_detached(in_RDI,in_RSI);
    if (BVar9 == 0) {
      iVar8 = (int)in_R8->tag;
      if (iVar8 == 0) {
        bVar4 = true;
        local_b0 = (ulong)(in_R8->u).int32;
        local_b8 = (double)(long)local_b0;
      }
      else {
        if (iVar8 != 7) goto switchD_001c2fd2_default;
        local_b8 = (in_R8->u).float64;
        local_b0 = (ulong)local_b8;
        bVar4 = (double)(long)local_b0 == local_b8;
      }
      uVar6 = (ushort)local_b0;
      switch((in_RSI->field_0).header.dummy2) {
      case 0x15:
      case 0x17:
        if (bVar4) {
          uVar11 = local_b0 & 0xff;
joined_r0x001c2fec:
          if (uVar11 == local_b0) {
            lVar3 = (in_RSI->u).object_data.tag;
            if (local_a4 < 1) {
              for (; local_9c != local_a0; local_9c = local_a4 + local_9c) {
                if (*(byte *)(lVar3 + (int)local_9c) == uVar6) {
                  local_a8 = local_9c;
                  break;
                }
              }
            }
            else {
              pvVar10 = memchr((void *)(lVar3 + (int)local_9c),(uint)uVar6,
                               (long)(int)(uVar7 - local_9c));
              if (pvVar10 != (void *)0x0) {
                local_a8 = (int)pvVar10 - (int)lVar3;
              }
            }
          }
        }
        break;
      case 0x16:
        if (bVar4) {
          uVar11 = (ulong)(char)local_b0;
          goto joined_r0x001c2fec;
        }
        break;
      case 0x18:
        if (bVar4) {
          uVar11 = (ulong)(short)uVar6;
joined_r0x001c3125:
          if (uVar11 == local_b0) {
            for (; local_9c != local_a0; local_9c = local_a4 + local_9c) {
              if (*(ushort *)((long)(in_RSI->u).func.var_refs + (long)(int)local_9c * 2) == uVar6) {
                local_a8 = local_9c;
                break;
              }
            }
          }
        }
        break;
      case 0x19:
        if (bVar4) {
          uVar11 = local_b0 & 0xffff;
          goto joined_r0x001c3125;
        }
        break;
      case 0x1a:
        if (bVar4) {
          uVar11 = (ulong)(int)local_b0;
joined_r0x001c31d3:
          if (uVar11 == local_b0) {
            for (; local_9c != local_a0; local_9c = local_a4 + local_9c) {
              if (*(int *)((long)(in_RSI->u).func.var_refs + (long)(int)local_9c * 4) ==
                  (int)local_b0) {
                local_a8 = local_9c;
                break;
              }
            }
          }
        }
        break;
      case 0x1b:
        if (bVar4) {
          uVar11 = local_b0 & 0xffffffff;
          goto joined_r0x001c31d3;
        }
        break;
      case 0x1c:
        if (NAN(local_b8)) {
          if (in_R9D == -1) {
            for (; local_9c != local_a0; local_9c = local_a4 + local_9c) {
              if (NAN(*(float *)((long)(in_RSI->u).func.var_refs + (long)(int)local_9c * 4))) {
                local_a8 = local_9c;
                break;
              }
            }
          }
        }
        else {
          fVar12 = (float)local_b8;
          if (((double)fVar12 == local_b8) && (!NAN((double)fVar12) && !NAN(local_b8))) {
            for (; local_9c != local_a0; local_9c = local_a4 + local_9c) {
              fVar1 = *(float *)((long)(in_RSI->u).func.var_refs + (long)(int)local_9c * 4);
              if ((fVar1 == fVar12) && (!NAN(fVar1) && !NAN(fVar12))) {
                local_a8 = local_9c;
                break;
              }
            }
          }
        }
        break;
      case 0x1d:
        if (NAN(local_b8)) {
          if (in_R9D == -1) {
            for (; local_9c != local_a0; local_9c = local_a4 + local_9c) {
              if (NAN((double)(in_RSI->u).func.var_refs[(int)local_9c])) {
                local_a8 = local_9c;
                break;
              }
            }
          }
        }
        else {
          for (; local_9c != local_a0; local_9c = local_a4 + local_9c) {
            pJVar2 = (in_RSI->u).func.var_refs[(int)local_9c];
            if (((double)pJVar2 == local_b8) && (!NAN((double)pJVar2) && !NAN(local_b8))) {
              local_a8 = local_9c;
              break;
            }
          }
        }
      }
    }
    else if (((in_R9D == -1) && (iVar8 = JS_IsUndefined(*in_R8), iVar8 != 0)) && (0 < (int)uVar7)) {
      local_a8 = 0;
    }
  }
switchD_001c2fd2_default:
  if (in_R9D == -1) {
    local_50 = (uint)(-1 < (int)local_a8);
    uStack_4c = uStack_c;
    local_48 = 1;
  }
  else {
    local_50 = local_a8;
    uStack_4c = uStack_2c;
    local_48 = 0;
  }
LAB_001c355f:
  JVar5.u._4_4_ = uStack_4c;
  JVar5.u.int32 = local_50;
  JVar5.tag = local_48;
  return JVar5;
}

Assistant:

static JSValue js_typed_array_indexOf(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv, int special)
{
    JSObject *p;
    int len, tag, is_int, is_bigint, k, stop, inc, res = -1;
    int64_t v64;
    double d;
    float f;

    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        goto exception;
    if (len == 0)
        goto done;

    if (special == special_lastIndexOf) {
        k = len - 1;
        if (argc > 1) {
            if (JS_ToFloat64(ctx, &d, argv[1]))
                goto exception;
            if (isnan(d)) {
                k = 0;
            } else {
                if (d >= 0) {
                    if (d < k) {
                        k = d;
                    }
                } else {
                    d += len;
                    if (d < 0)
                        goto done;
                    k = d;
                }
            }
        }
        stop = -1;
        inc = -1;
    } else {
        k = 0;
        if (argc > 1) {
            if (JS_ToInt32Clamp(ctx, &k, argv[1], 0, len, len))
                goto exception;
        }
        stop = len;
        inc = 1;
    }

    p = JS_VALUE_GET_OBJ(this_val);
    /* if the array was detached, no need to go further (but no
       exception is raised) */
    if (typed_array_is_detached(ctx, p)) {
        /* "includes" scans all the properties, so "undefined" can match */
        if (special == special_includes && JS_IsUndefined(argv[0]) && len > 0)
            res = 0;
        goto done;
    }
    
    is_bigint = 0;
    is_int = 0; /* avoid warning */
    v64 = 0; /* avoid warning */
    tag = JS_VALUE_GET_NORM_TAG(argv[0]);
    if (tag == JS_TAG_INT) {
        is_int = 1;
        v64 = JS_VALUE_GET_INT(argv[0]);
        d = v64;
    } else
    if (tag == JS_TAG_FLOAT64) {
        d = JS_VALUE_GET_FLOAT64(argv[0]);
        v64 = d;
        is_int = (v64 == d);
    } else
#ifdef CONFIG_BIGNUM
    if (tag == JS_TAG_BIG_INT) {
        JSBigFloat *p1 = JS_VALUE_GET_PTR(argv[0]);
        
        if (p->class_id == JS_CLASS_BIG_INT64_ARRAY) {
            if (bf_get_int64(&v64, &p1->num, 0) != 0)
                goto done;
        } else if (p->class_id == JS_CLASS_BIG_UINT64_ARRAY) {
            if (bf_get_uint64((uint64_t *)&v64, &p1->num) != 0)
                goto done;
        } else {
            goto done;
        }
        d = 0;
        is_bigint = 1;
    } else
#endif
    {
        goto done;
    }

    switch (p->class_id) {
    case JS_CLASS_INT8_ARRAY:
        if (is_int && (int8_t)v64 == v64)
            goto scan8;
        break;
    case JS_CLASS_UINT8C_ARRAY:
    case JS_CLASS_UINT8_ARRAY:
        if (is_int && (uint8_t)v64 == v64) {
            const uint8_t *pv, *pp;
            uint16_t v;
        scan8:
            pv = p->u.array.u.uint8_ptr;
            v = v64;
            if (inc > 0) {
                pp = memchr(pv + k, v, len - k);
                if (pp)
                    res = pp - pv;
            } else {
                for (; k != stop; k += inc) {
                    if (pv[k] == v) {
                        res = k;
                        break;
                    }
                }
            }
        }
        break;
    case JS_CLASS_INT16_ARRAY:
        if (is_int && (int16_t)v64 == v64)
            goto scan16;
        break;
    case JS_CLASS_UINT16_ARRAY:
        if (is_int && (uint16_t)v64 == v64) {
            const uint16_t *pv;
            uint16_t v;
        scan16:
            pv = p->u.array.u.uint16_ptr;
            v = v64;
            for (; k != stop; k += inc) {
                if (pv[k] == v) {
                    res = k;
                    break;
                }
            }
        }
        break;
    case JS_CLASS_INT32_ARRAY:
        if (is_int && (int32_t)v64 == v64)
            goto scan32;
        break;
    case JS_CLASS_UINT32_ARRAY:
        if (is_int && (uint32_t)v64 == v64) {
            const uint32_t *pv;
            uint32_t v;
        scan32:
            pv = p->u.array.u.uint32_ptr;
            v = v64;
            for (; k != stop; k += inc) {
                if (pv[k] == v) {
                    res = k;
                    break;
                }
            }
        }
        break;
    case JS_CLASS_FLOAT32_ARRAY:
        if (is_bigint)
            break;
        if (isnan(d)) {
            const float *pv = p->u.array.u.float_ptr;
            /* special case: indexOf returns -1, includes finds NaN */
            if (special != special_includes)
                goto done;
            for (; k != stop; k += inc) {
                if (isnan(pv[k])) {
                    res = k;
                    break;
                }
            }
        } else if ((f = (float)d) == d) {
            const float *pv = p->u.array.u.float_ptr;
            for (; k != stop; k += inc) {
                if (pv[k] == f) {
                    res = k;
                    break;
                }
            }
        }
        break;
    case JS_CLASS_FLOAT64_ARRAY:
        if (is_bigint)
            break;
        if (isnan(d)) {
            const double *pv = p->u.array.u.double_ptr;
            /* special case: indexOf returns -1, includes finds NaN */
            if (special != special_includes)
                goto done;
            for (; k != stop; k += inc) {
                if (isnan(pv[k])) {
                    res = k;
                    break;
                }
            }
        } else {
            const double *pv = p->u.array.u.double_ptr;
            for (; k != stop; k += inc) {
                if (pv[k] == d) {
                    res = k;
                    break;
                }
            }
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_CLASS_BIG_INT64_ARRAY:
        if (is_bigint || (is_math_mode(ctx) && is_int &&
                          v64 >= -MAX_SAFE_INTEGER &&
                          v64 <= MAX_SAFE_INTEGER)) {
            goto scan64;
        }
        break;
    case JS_CLASS_BIG_UINT64_ARRAY:
        if (is_bigint || (is_math_mode(ctx) && is_int &&
                          v64 >= 0 && v64 <= MAX_SAFE_INTEGER)) {
            const uint64_t *pv;
            uint64_t v;
        scan64:
            pv = p->u.array.u.uint64_ptr;
            v = v64;
            for (; k != stop; k += inc) {
                if (pv[k] == v) {
                    res = k;
                    break;
                }
            }
        }
        break;
#endif
    }

done:
    if (special == special_includes)
        return JS_NewBool(ctx, res >= 0);
    else
        return JS_NewInt32(ctx, res);

exception:
    return JS_EXCEPTION;
}